

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch_pre.hpp
# Opt level: O0

Array __thiscall notch::pre::OneHotEncoder::unapply(OneHotEncoder *this,Array *input)

{
  float fVar1;
  int iVar2;
  ulong uVar3;
  size_t sVar4;
  ostream *poVar5;
  invalid_argument *this_00;
  size_type sVar6;
  mapped_type *pmVar7;
  float *pfVar8;
  reference pvVar9;
  valarray<float> *in_RDX;
  float *extraout_RDX;
  Array AVar10;
  key_type local_20c;
  ulong local_208;
  size_t i;
  size_t maxIdx;
  float maxVal;
  size_t nColsPerFeature;
  ulong local_1e0;
  size_t outCol;
  size_t inCol;
  string local_1c8 [48];
  ostringstream local_198 [8];
  ostringstream ss;
  Array *input_local;
  OneHotEncoder *this_local;
  Array *output;
  
  sVar4 = core::std::valarray<float>::size(in_RDX);
  if (sVar4 == input[5]._M_size + (long)input[5]._M_data) {
    inCol._6_1_ = 0;
    inCol._0_4_ = 0;
    sVar4 = core::std::valarray<float>::size(in_RDX);
    core::std::valarray<float>::valarray
              ((valarray<float> *)this,(float *)&inCol,sVar4 - (long)input[5]._M_data);
    outCol = 0;
    for (local_1e0 = 0; uVar3 = local_1e0,
        sVar4 = core::std::valarray<float>::size((valarray<float> *)this), uVar3 < sVar4;
        local_1e0 = local_1e0 + 1) {
      nColsPerFeature._4_4_ = (key_type)local_1e0;
      sVar6 = core::std::
              map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
              ::count((map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                       *)(input + 2),(key_type *)((long)&nColsPerFeature + 4));
      if (sVar6 == 0) {
        pfVar8 = core::std::valarray<float>::operator[](in_RDX,outCol);
        fVar1 = *pfVar8;
        pfVar8 = core::std::valarray<float>::operator[]((valarray<float> *)this,local_1e0);
        *pfVar8 = fVar1;
        outCol = outCol + 1;
      }
      else {
        maxIdx._4_4_ = (key_type)local_1e0;
        pmVar7 = core::std::
                 map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                 ::operator[]((map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                               *)(input + 2),(key_type *)((long)&maxIdx + 4));
        _maxVal = core::std::vector<int,_std::allocator<int>_>::size(pmVar7);
        maxIdx._0_4_ = core::std::numeric_limits<float>::lowest();
        i = 0;
        for (local_208 = 0; local_208 < _maxVal; local_208 = local_208 + 1) {
          pfVar8 = core::std::valarray<float>::operator[](in_RDX,outCol + local_208);
          if ((float)maxIdx < *pfVar8) {
            pfVar8 = core::std::valarray<float>::operator[](in_RDX,outCol + local_208);
            maxIdx._0_4_ = *pfVar8;
            i = local_208;
          }
        }
        local_20c = (key_type)local_1e0;
        pmVar7 = core::std::
                 map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                 ::operator[]((map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                               *)(input + 2),&local_20c);
        pvVar9 = core::std::vector<int,_std::allocator<int>_>::operator[](pmVar7,i);
        iVar2 = *pvVar9;
        pfVar8 = core::std::valarray<float>::operator[]((valarray<float> *)this,local_1e0);
        *pfVar8 = (float)iVar2;
        outCol = _maxVal + outCol;
      }
    }
    AVar10._M_data = extraout_RDX;
    AVar10._M_size = (size_t)this;
    return AVar10;
  }
  std::__cxx11::ostringstream::ostringstream(local_198);
  poVar5 = std::operator<<((ostream *)local_198,"input.size(): ");
  sVar4 = core::std::valarray<float>::size(in_RDX);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,sVar4);
  poVar5 = std::operator<<(poVar5,", expected: ");
  std::ostream::operator<<(poVar5,input[5]._M_size + (long)input[5]._M_data);
  inCol._7_1_ = 1;
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::__cxx11::ostringstream::str();
  std::invalid_argument::invalid_argument(this_00,local_1c8);
  inCol._7_1_ = 0;
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

virtual Array unapply(const Array &input) {
        if (input.size() != nInputCols + nExtraCols) {
            std::ostringstream ss;
            ss << "input.size(): " << input.size()
               << ", expected: " << nInputCols + nExtraCols;
            throw std::invalid_argument(ss.str());
        }
        Array output(0.0, input.size() - nExtraCols);
        size_t inCol = 0;
        for (size_t outCol = 0; outCol < output.size(); ++outCol) {
            if (columnValues.count(outCol)) { // replace with one column
                // find the column with the largest output
                size_t nColsPerFeature = columnValues[outCol].size();
                float maxVal = std::numeric_limits<float>::lowest();
                size_t maxIdx = 0;
                for (size_t i = 0; i < nColsPerFeature; ++i) {
                    if (input[inCol + i] > maxVal) {
                        maxVal = input[inCol + i];
                        maxIdx = i;
                    }
                }
                // use the category corresponding to the largest value
                output[outCol] = columnValues[outCol][maxIdx];
                inCol += nColsPerFeature;
            } else {
                output[outCol] = input[inCol];
                ++inCol;
            }
        }
        return output;
    }